

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void comparing(double x)

{
  double x_local;
  
  NewtonsMethod(x,(Func1D *)Functions::f,(Func1D *)Functions::df,1e-32,&it);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,0.001,1e-32,&it);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,1e-05,1e-32,&it);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  DiscreteNewtonsMethod(x,(Func1D *)Functions::f,1e-07,1e-32,&it);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void comparing(double x) {
    NewtonsMethod(x, Functions::f, Functions::df, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-3, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-5, 1e-32);
    std::cout << std::endl;
    DiscreteNewtonsMethod(x, Functions::f, 1e-7, 1e-32);
    std::cout << std::endl;
}